

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O3

void iutest::detail::StringReplaceToLF(string *str)

{
  ulong uVar1;
  
  for (uVar1 = std::__cxx11::string::find((char *)str,0x11c215,0); uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find((char *)str,0x11c215,uVar1 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar1,(char *)0x2,0x11dfdd);
  }
  for (uVar1 = std::__cxx11::string::find((char *)str,0x11c4fb,0); uVar1 != 0xffffffffffffffff;
      uVar1 = std::__cxx11::string::find((char *)str,0x11c4fb,uVar1 + 1)) {
    std::__cxx11::string::replace((ulong)str,uVar1,(char *)0x1,0x11dfdd);
  }
  return;
}

Assistant:

inline void StringReplaceToLF(::std::string& str)
{
    StringReplace(str, "\r\n", 2, "\n");
    StringReplace(str, "\r"  , 1, "\n");
}